

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  Bioengineering *this;
  ChemicalEngineering *this_00;
  ComputerEngineering *this_01;
  ComputerScience *this_02;
  CSBusinessApplications *this_03;
  ElectricalEngineering *this_04;
  EnvironmentalEngineering *this_05;
  MechanicalEngineering *this_06;
  MaterialScience *this_07;
  ostream *poVar3;
  ShallowPrint *this_08;
  mapped_type *ppvVar4;
  reference ppCVar5;
  string local_178 [8];
  string userInput;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  local_158;
  undefined1 local_120 [8];
  CatalogReader reader;
  AbstractMajor *userMajor;
  PrintAlgorithm *printer;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  majorCourses;
  CourseComponent *root;
  string major;
  
  std::__cxx11::string::string((string *)&root);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
                   *)&printer);
  std::operator<<((ostream *)&std::cout,"Enter a major (ALL UPPERCASE): ");
  std::operator>>((istream *)&std::cin,(string *)&root);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&root
                          ,"BIOENGINEERING");
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &root,"BIEN"), bVar2)) {
    this = (Bioengineering *)operator_new(0x40);
    Bioengineering::Bioengineering(this);
    reader._136_8_ = this;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &root,"CHEMICAL ENGINEERING");
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&root,"CHE"), bVar2)) {
      this_00 = (ChemicalEngineering *)operator_new(0x40);
      ChemicalEngineering::ChemicalEngineering(this_00);
      reader._136_8_ = this_00;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &root,"COMPUTER ENGINEERING");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&root,"CEN"), bVar2)) {
        this_01 = (ComputerEngineering *)operator_new(0x40);
        ComputerEngineering::ComputerEngineering(this_01);
        reader._136_8_ = this_01;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&root,"COMPUTER SCINECE");
        if ((bVar2) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&root,"CS"), bVar2)) {
          this_02 = (ComputerScience *)operator_new(0x40);
          ComputerScience::ComputerScience(this_02);
          reader._136_8_ = this_02;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&root,"COMPUTER SCIENCE WITH BUSINESS APPLICATIONS");
          if ((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&root,"CSBA"), bVar2)) {
            this_03 = (CSBusinessApplications *)operator_new(0x40);
            CSBusinessApplications::CSBusinessApplications(this_03);
            reader._136_8_ = this_03;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&root,"ELECTRICAL ENGINEERING");
            if ((bVar2) ||
               (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&root,"EE"), bVar2)) {
              this_04 = (ElectricalEngineering *)operator_new(0x40);
              ElectricalEngineering::ElectricalEngineering(this_04);
              reader._136_8_ = this_04;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&root,"ENVIRONMENTAL ENGINEERING");
              if ((bVar2) ||
                 (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&root,"ENVE"), bVar2)) {
                this_05 = (EnvironmentalEngineering *)operator_new(0x40);
                EnvironmentalEngineering::EnvironmentalEngineering(this_05);
                reader._136_8_ = this_05;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&root,"MECHANICAL ENGINEERING");
                if ((bVar2) ||
                   (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&root,"ME"), bVar2)) {
                  this_06 = (MechanicalEngineering *)operator_new(0x40);
                  MechanicalEngineering::MechanicalEngineering(this_06);
                  reader._136_8_ = this_06;
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&root,"MATERIALS SCIENCE AND ENGINEERING");
                  if (((!bVar2) &&
                      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&root,"MSE"), !bVar2)) &&
                     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&root,"MATERIAL SCIENCE AND ENGINEERING"), !bVar2))
                  {
                    poVar3 = std::operator<<((ostream *)&std::cout,"Invalid major entered.");
                    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                    exit(1);
                  }
                  this_07 = (MaterialScience *)operator_new(0x40);
                  MaterialScience::MaterialScience(this_07);
                  reader._136_8_ = this_07;
                }
              }
            }
          }
        }
      }
    }
  }
  AbstractMajor::getRequirements((AbstractMajor *)reader._136_8_);
  CatalogReader::CatalogReader((CatalogReader *)local_120,(AbstractMajor *)reader._136_8_);
  CatalogReader::setDebugOn((CatalogReader *)local_120,false);
  CatalogReader::createCourseHeirarchy_abi_cxx11_(&local_158,(CatalogReader *)local_120);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  ::operator=((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
               *)&printer,&local_158);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  ::~unordered_map(&local_158);
  poVar3 = std::operator<<((ostream *)&std::cout,"Succesfully retreived heirarchy");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  majorCourses._M_h._M_single_bucket =
       (__node_base_ptr)
       buildGraph((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
                   *)&printer,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"DISPLAYING COURSE TREE ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this_08 = (ShallowPrint *)operator_new(8);
  ShallowPrint::ShallowPrint(this_08);
  (**(this_08->super_PrintAlgorithm)._vptr_PrintAlgorithm)
            (this_08,majorCourses._M_h._M_single_bucket);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Enter taken courses in the format of: \'CHEM 001A\'. Enter \'Q\' when done."
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_178);
  std::operator>>((istream *)&std::cin,local_178);
  while (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_178,"Q"), bVar2) {
    std::operator>>((istream *)&std::cin,local_178);
    p_Var1 = majorCourses._M_h._M_single_bucket;
    ppvVar4 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
              ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
                    *)&printer,(key_type *)local_178);
    ppCVar5 = std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::at(*ppvVar4,0);
    (*(code *)p_Var1->_M_nxt[2]._M_nxt)(p_Var1,*ppCVar5);
  }
  std::__cxx11::string::~string(local_178);
  CatalogReader::~CatalogReader((CatalogReader *)local_120);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
                    *)&printer);
  std::__cxx11::string::~string((string *)&root);
  return 0;
}

Assistant:

int main() {

    string major;
    CourseComponent* root;
    unordered_map<string, vector<CourseComponent*>*> majorCourses;
    PrintAlgorithm* printer;

    cout << "Enter a major (ALL UPPERCASE): ";
    cin >> major;
    cout << endl;

    // Convert user string to uppercase for simplicity purposes

    AbstractMajor* userMajor;
    if (major == "BIOENGINEERING" || major == "BIEN") {
        userMajor = new Bioengineering();
    }

    else if (major == "CHEMICAL ENGINEERING" || major == "CHE") {
        userMajor = new ChemicalEngineering();
    }

    else if (major == "COMPUTER ENGINEERING" || major == "CEN") {
        userMajor = new ComputerEngineering();
    }

    else if (major == "COMPUTER SCINECE" || major == "CS") {
        userMajor = new ComputerScience();
    }

    else if (major == "COMPUTER SCIENCE WITH BUSINESS APPLICATIONS" || major == "CSBA") {
        userMajor = new CSBusinessApplications();
    }

    else if (major == "ELECTRICAL ENGINEERING" || major == "EE") {
        userMajor = new ElectricalEngineering();
    }

    else if (major == "ENVIRONMENTAL ENGINEERING" || major == "ENVE") {
        userMajor = new EnvironmentalEngineering();
    }

    else if (major == "MECHANICAL ENGINEERING" || major == "ME") {
        userMajor = new MechanicalEngineering();
    }

    else if (major == "MATERIALS SCIENCE AND ENGINEERING" || major == "MSE" || major == "MATERIAL SCIENCE AND ENGINEERING") {
        userMajor = new MaterialScience();
    }

    // Program exits if the user inputs an invalid major
    else {
        cout << "Invalid major entered." << endl;
        exit(1);
    }

    userMajor->getRequirements();
    // Pass in the major to the CatalogReader
    CatalogReader reader(userMajor);

    reader.setDebugOn(false);
    // Returns unordered map of courses, stored by "name of course", <vector of linked courses and itself>
    majorCourses = reader.createCourseHeirarchy();
    cout << "Succesfully retreived heirarchy" << endl;
    root = buildGraph(majorCourses, false);


    cout << "DISPLAYING COURSE TREE " << endl;
    
    printer = new ShallowPrint();
    printer->print(root);

    cout << "Enter taken courses in the format of: 'CHEM 001A'. Enter 'Q' when done." << endl;
    string userInput;
    cin >> userInput;

    while (userInput != "Q") {
        cin >> userInput;
        root->remove(majorCourses.at(userInput)->at(0));
    }
}